

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_global.c
# Opt level: O0

void dealloc_globals_chain(Dwarf_Debug dbg,Dwarf_Chain head_chain)

{
  int iVar1;
  Dwarf_Ptr space;
  Dwarf_Global_Context space_00;
  Dwarf_Chain pDVar2;
  Dwarf_Chain prev;
  int itemtype;
  Dwarf_Global item;
  Dwarf_Global_Context curcontext;
  Dwarf_Global_Context lastcontext;
  Dwarf_Chain pDStack_20;
  int chaintype;
  Dwarf_Chain curr_chain;
  Dwarf_Chain head_chain_local;
  Dwarf_Debug dbg_local;
  
  curcontext = (Dwarf_Global_Context)0x0;
  pDStack_20 = head_chain;
  while (pDStack_20 != (Dwarf_Chain)0x0) {
    space = pDStack_20->ch_item;
    iVar1 = pDStack_20->ch_itemtype;
    space_00 = *(Dwarf_Global_Context *)((long)space + 0x10);
    if ((space_00 != (Dwarf_Global_Context)0x0) && (space_00 != curcontext)) {
      dwarf_dealloc(dbg,space_00,(ulong)space_00->pu_alloc_type);
      curcontext = space_00;
    }
    dwarf_dealloc(dbg,space,(long)iVar1);
    pDStack_20->ch_item = (void *)0x0;
    pDVar2 = pDStack_20->ch_next;
    dwarf_dealloc(dbg,pDStack_20,0x1f);
    pDStack_20 = pDVar2;
  }
  return;
}

Assistant:

static void
dealloc_globals_chain(Dwarf_Debug dbg,
    Dwarf_Chain head_chain)
{
    Dwarf_Chain curr_chain = 0;
    int chaintype = DW_DLA_CHAIN;
    Dwarf_Global_Context lastcontext = 0;
    Dwarf_Global_Context curcontext = 0;

    curr_chain = head_chain;
    for (; curr_chain; ) {
        Dwarf_Global item = 0;
        int itemtype = 0;
        Dwarf_Chain prev = 0;

        item = (Dwarf_Global)curr_chain->ch_item;
        itemtype = curr_chain->ch_itemtype;
        curcontext = item->gl_context;
        if (curcontext && curcontext != lastcontext) {
            /* First time we see a context, dealloc it. */
            lastcontext = curcontext;
            dwarf_dealloc(dbg,curcontext,curcontext->pu_alloc_type);
        }
        prev = curr_chain;
        dwarf_dealloc(dbg, item,itemtype);
        prev->ch_item = 0;
        curr_chain = curr_chain->ch_next;
        dwarf_dealloc(dbg, prev, chaintype);
    }
}